

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_gettime_monotonic(event_base *base,timeval *tv)

{
  int local_1c;
  int rv;
  timeval *tv_local;
  event_base *base_local;
  
  local_1c = -1;
  if ((base != (event_base *)0x0) && (tv != (timeval *)0x0)) {
    if (base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,base->th_base_lock);
    }
    local_1c = evutil_gettime_monotonic_(&base->monotonic_timer,tv);
    if (base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
    }
  }
  return local_1c;
}

Assistant:

int
event_gettime_monotonic(struct event_base *base, struct timeval *tv)
{
  int rv = -1;

  if (base && tv) {
    EVBASE_ACQUIRE_LOCK(base, th_base_lock);
    rv = evutil_gettime_monotonic_(&(base->monotonic_timer), tv);
    EVBASE_RELEASE_LOCK(base, th_base_lock);
  }

  return rv;
}